

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O2

common_ngram_cache *
common_ngram_cache_load(common_ngram_cache *__return_storage_ptr__,string *filename)

{
  long *plVar1;
  string *psVar2;
  char *pcVar3;
  undefined8 uVar4;
  int iVar5;
  int32_t ntokens;
  char *local_298;
  _Hashtable<common_ngram,std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>,std::__detail::_Select1st,std::equal_to<common_ngram>,common_ngram_hash_function,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_290;
  int32_t count;
  llama_token token;
  common_ngram_cache_part token_counts;
  common_ngram ngram;
  ifstream hashmap_file;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&hashmap_file,(string *)filename,_S_bin);
  if ((abStack_218[*(long *)(_hashmap_file + -0x18)] & 5) != 0) {
    psVar2 = (string *)__cxa_allocate_exception(0x20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &token_counts,"Unable to open file ",filename);
    std::ios_base::failure[abi:cxx11]::failure(psVar2);
    __cxa_throw(psVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_290 = (_Hashtable<common_ngram,std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>,std::__detail::_Select1st,std::equal_to<common_ngram>,common_ngram_hash_function,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)__return_storage_ptr__;
  common_ngram::common_ngram(&ngram);
  local_298 = "!hashmap_file.eof()";
  do {
    plVar1 = (long *)std::istream::read((char *)&hashmap_file,(long)&ngram);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
      if ((abStack_218[*(long *)(_hashmap_file + -0x18)] & 2) != 0) {
        std::ifstream::~ifstream(&hashmap_file);
        return (common_ngram_cache *)local_290;
      }
      local_298 = "hashmap_file.eof()";
      uVar4 = 0x100;
LAB_001ca974:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                 ,uVar4,"GGML_ASSERT(%s) failed",local_298);
    }
    if ((abStack_218[*(long *)(_hashmap_file + -0x18)] & 2) != 0) {
      uVar4 = 0xf0;
      goto LAB_001ca974;
    }
    plVar1 = (long *)std::istream::read((char *)&hashmap_file,(long)&ntokens);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
      uVar4 = 0xf1;
      local_298 = "hashmap_file.read(ntokensc, sizeof(int32_t))";
      goto LAB_001ca974;
    }
    if (ntokens < 1) {
      uVar4 = 0xf2;
      local_298 = "ntokens > 0";
      goto LAB_001ca974;
    }
    token_counts._M_h._M_buckets = &token_counts._M_h._M_single_bucket;
    token_counts._M_h._M_bucket_count = 1;
    token_counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    token_counts._M_h._M_element_count = 0;
    token_counts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    token_counts._M_h._M_rehash_policy._M_next_resize = 0;
    token_counts._M_h._M_single_bucket = (__node_base_ptr)0x0;
    for (iVar5 = 0; iVar5 < ntokens; iVar5 = iVar5 + 1) {
      if ((abStack_218[*(long *)(_hashmap_file + -0x18)] & 2) != 0) {
        uVar4 = 0xf6;
LAB_001ca924:
        pcVar3 = "!hashmap_file.eof()";
LAB_001ca939:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,uVar4,"GGML_ASSERT(%s) failed",pcVar3);
      }
      plVar1 = (long *)std::istream::read((char *)&hashmap_file,(long)&token);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
        uVar4 = 0xf7;
        pcVar3 = "hashmap_file.read(tokenc, sizeof(llama_token))";
        goto LAB_001ca939;
      }
      if ((abStack_218[*(long *)(_hashmap_file + -0x18)] & 2) != 0) {
        uVar4 = 0xf8;
        goto LAB_001ca924;
      }
      plVar1 = (long *)std::istream::read((char *)&hashmap_file,(long)&count);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
        uVar4 = 0xf9;
        pcVar3 = "hashmap_file.read(countc, sizeof(int32_t))";
        goto LAB_001ca939;
      }
      if (count < 1) {
        uVar4 = 0xfa;
        pcVar3 = "count > 0";
        goto LAB_001ca939;
      }
      std::
      _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<int&,int&>
                ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&token_counts._M_h,&token,&count);
    }
    std::
    _Hashtable<common_ngram,std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<common_ngram_const,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>,std::__detail::_Select1st,std::equal_to<common_ngram>,common_ngram_hash_function,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<common_ngram&,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>&>
              (local_290,&ngram,&token_counts._M_h);
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&token_counts._M_h);
  } while( true );
}

Assistant:

common_ngram_cache common_ngram_cache_load(std::string & filename) {
    std::ifstream hashmap_file(filename, std::ios::binary);
    if (!hashmap_file) {
        throw std::ifstream::failure("Unable to open file " + filename);
    }
    common_ngram_cache ngram_cache;

    common_ngram ngram;
    int32_t     ntokens;
    llama_token token;
    int32_t     count;

    char * ngramc   = reinterpret_cast<char*>(&ngram);
    char * ntokensc = reinterpret_cast<char*>(&ntokens);
    char * tokenc   = reinterpret_cast<char*>(&token);
    char * countc   = reinterpret_cast<char*>(&count);
    while(hashmap_file.read(ngramc, sizeof(common_ngram))) {
        GGML_ASSERT(!hashmap_file.eof());
        GGML_ASSERT(hashmap_file.read(ntokensc, sizeof(int32_t)));
        GGML_ASSERT(ntokens > 0);
        common_ngram_cache_part token_counts;

        for (int i = 0; i < ntokens; ++i) {
            GGML_ASSERT(!hashmap_file.eof());
            GGML_ASSERT(hashmap_file.read(tokenc, sizeof(llama_token)));
            GGML_ASSERT(!hashmap_file.eof());
            GGML_ASSERT(hashmap_file.read(countc, sizeof(int32_t)));
            GGML_ASSERT(count > 0);
            token_counts.emplace(token, count);
        }

        ngram_cache.emplace(ngram, token_counts);
    }
    GGML_ASSERT(hashmap_file.eof());

    return ngram_cache;
}